

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.cc
# Opt level: O3

void __thiscall
message_test_should_compare_version_Test::TestBody(message_test_should_compare_version_Test *this)

{
  AssertionResult gtest_ar_;
  
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(message_test, should_compare_version)
{
    using v42 = Fixpp::v42::Version;
    ASSERT_TRUE(v42::equals("FIX.4.2", 7));
}